

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QIcon qvariant_cast<QIcon>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  QIconPrivate *in_RDI;
  long in_FS_OFFSET;
  QIcon *t;
  QMetaType targetType;
  QIcon *in_stack_ffffffffffffffa8;
  QIconPrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar3 = QMetaType::fromType<QIcon>();
  QVariant::Private::type((Private *)this);
  bVar2 = operator==((QMetaType *)this,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    QVariant::Private::get<QIcon>((Private *)0xa40701);
    QIcon::QIcon((QIcon *)this,in_stack_ffffffffffffffa8);
  }
  else {
    this->engine = (QIconEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::QIcon((QIcon *)this);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0xa40742);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar3.d_ptr,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QIcon)in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}